

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::internal::
parse_format_string<false,char,fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>&>
          (internal *this,basic_string_view<char> format_str,
          format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          *handler)

{
  internal *begin;
  bool bVar1;
  format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  *this_00;
  char *pcVar2;
  internal *last;
  iterator iVar3;
  char *p;
  id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_&,_char>
  local_40;
  writer write;
  
  this_00 = (format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
             *)format_str.size_;
  last = (internal *)(format_str.data_ + (long)this);
  write.handler_ = this_00;
  do {
    if (this == last) {
      return;
    }
    p = (char *)this;
    if ((*this != (internal)0x7b) &&
       (bVar1 = find<false,char,char_const*>((char *)this,(char *)last,'{',&p), !bVar1)) {
      parse_format_string<false,_char,_fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_&>
      ::writer::operator()(&write,(char *)this,(char *)last);
      return;
    }
    parse_format_string<false,_char,_fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_&>
    ::writer::operator()(&write,(char *)this,p);
    begin = (internal *)(p + 1);
    if (begin == last) {
      pcVar2 = "invalid format string";
      p = (char *)begin;
      goto LAB_0012dbd0;
    }
    if (*begin == (internal)0x7b) {
      pcVar2 = p + 2;
      p = (char *)begin;
      format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
      ::on_text(this_00,(char *)begin,pcVar2);
      pcVar2 = p;
    }
    else {
      if (*begin != (internal)0x7d) {
        p = (char *)begin;
        local_40.handler = this_00;
        p = parse_arg_id<char,fmt::v5::internal::id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>&,char>>
                      ((char *)begin,(char *)last,&local_40);
        if ((internal *)p != last) {
          if ((internal)*p == (internal)0x3a) {
            iVar3.end_ = (char *)last;
            iVar3.ptr_ = (char *)((internal *)p + 1);
            iVar3 = format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                    ::on_format_specs(this_00,iVar3);
            pcVar2 = iVar3.ptr_;
            if ((pcVar2 == iVar3.end_) || (*pcVar2 != '}')) {
              pcVar2 = "unknown format specifier";
              goto LAB_0012dbd0;
            }
            goto LAB_0012db99;
          }
          if ((internal)*p == (internal)0x7d) goto LAB_0012db73;
        }
        pcVar2 = "missing \'}\' in format string";
LAB_0012dbd0:
        error_handler::on_error((error_handler *)this_00,pcVar2);
        return;
      }
      p = (char *)begin;
      format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
      ::on_arg_id(this_00);
LAB_0012db73:
      format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
      ::on_replacement_field(this_00,p);
      pcVar2 = p;
    }
LAB_0012db99:
    p = pcVar2;
    this = (internal *)(p + 1);
  } while( true );
}

Assistant:

FMT_CONSTEXPR void parse_format_string(
        basic_string_view<Char> format_str, Handler &&handler) {
  struct writer {
    FMT_CONSTEXPR void operator()(const Char *begin, const Char *end) {
      if (begin == end) return;
      for (;;) {
        const Char *p = FMT_NULL;
        if (!find<IS_CONSTEXPR>(begin, end, '}', p))
          return handler_.on_text(begin, end);
        ++p;
        if (p == end || *p != '}')
          return handler_.on_error("unmatched '}' in format string");
        handler_.on_text(begin, p);
        begin = p + 1;
      }
    }
    Handler &handler_;
  } write{handler};
  auto begin = format_str.data(), end = begin + format_str.size();
  while (begin != end) {
    // Doing two passes with memchr (one for '{' and another for '}') is up to
    // 2.5x faster than the naive one-pass implementation on big format strings.
    const Char *p = begin;
    if (*begin != '{' && !find<IS_CONSTEXPR>(begin, end, '{', p))
      return write(begin, end);
    write(begin, p);
    ++p;
    if (p == end)
      return handler.on_error("invalid format string");
    if (*p == '}') {
      handler.on_arg_id();
      handler.on_replacement_field(p);
    } else if (*p == '{') {
      handler.on_text(p, p + 1);
    } else {
      p = parse_arg_id(p, end, id_adapter<Handler, Char>{handler});
      Char c = p != end ? *p : 0;
      if (c == '}') {
        handler.on_replacement_field(p);
      } else if (c == ':') {
        internal::null_terminating_iterator<Char> it(p + 1, end);
        it = handler.on_format_specs(it);
        if (*it != '}')
          return handler.on_error("unknown format specifier");
        p = pointer_from(it);
      } else {
        return handler.on_error("missing '}' in format string");
      }
    }
    begin = p + 1;
  }
}